

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void change_var_names(MIR_context_t new_ctx,VARR_MIR_var_t *vars)

{
  byte bVar1;
  MIR_var_t *pMVar2;
  char *pcVar3;
  ushort **ppuVar4;
  long in_RCX;
  long extraout_RDX;
  ulong uVar5;
  long lVar6;
  
  if (vars != (VARR_MIR_var_t *)0x0) {
    if (vars->els_num != 0) {
      lVar6 = 8;
      uVar5 = 0;
      do {
        pMVar2 = vars->varr;
        pcVar3 = get_ctx_str(new_ctx,*(char **)((long)&pMVar2->type + lVar6));
        *(char **)((long)&pMVar2->type + lVar6) = pcVar3;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 < vars->els_num);
    }
    return;
  }
  change_var_names_cold_1();
  fputc(0x22,(FILE *)vars);
  if (extraout_RDX != 0) {
    lVar6 = 0;
    do {
      bVar1 = *(byte *)(in_RCX + lVar6);
      if (bVar1 == 0x22) {
        pcVar3 = "\\\"";
LAB_001390c3:
        fwrite(pcVar3,2,1,(FILE *)vars);
      }
      else {
        if (bVar1 == 0x5c) {
          pcVar3 = "\\\\";
          goto LAB_001390c3;
        }
        ppuVar4 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar4 + (long)(char)bVar1 * 2 + 1) & 0x40) == 0) {
          switch(bVar1) {
          case 7:
            pcVar3 = "\\a";
            break;
          case 8:
            pcVar3 = "\\b";
            break;
          case 9:
            pcVar3 = "\\t";
            break;
          case 10:
            pcVar3 = "\\n";
            break;
          case 0xb:
            pcVar3 = "\\v";
            break;
          case 0xc:
            pcVar3 = "\\f";
            break;
          default:
            fprintf((FILE *)vars,"\\%03o",(ulong)bVar1);
            goto LAB_001390cb;
          }
          goto LAB_001390c3;
        }
        fputc((int)(char)bVar1,(FILE *)vars);
      }
LAB_001390cb:
      lVar6 = lVar6 + 1;
    } while (extraout_RDX != lVar6);
  }
  fputc(0x22,(FILE *)vars);
  return;
}

Assistant:

static void change_var_names (MIR_context_t new_ctx, VARR (MIR_var_t) * vars) {
  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, vars); i++) {
    MIR_var_t *var_ptr = &VARR_ADDR (MIR_var_t, vars)[i];
    var_ptr->name = get_ctx_str (new_ctx, var_ptr->name);
  }
}